

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_x509.cc
# Opt level: O0

int write_signer_info(CBB *out,void *arg)

{
  uint uVar1;
  int iVar2;
  uchar *data;
  X509_NAME *in;
  ASN1_INTEGER *in_00;
  env_md_ctx_st *peVar3;
  EVP_MD *md;
  EVP_MD_CTX *pEVar4;
  size_t local_140;
  size_t sig_len;
  uint8_t *ptr;
  EVP_PKEY *pkey;
  ASN1_OCTET_STRING *skid;
  CBB signature;
  CBB null;
  CBB signing_algo;
  CBB child;
  CBB seq;
  uint64_t version;
  signer_info_data *si_data;
  void *arg_local;
  CBB *out_local;
  
  uVar1 = 1;
  if ((*(byte *)((long)arg + 0x28) & 1) != 0) {
    uVar1 = 3;
  }
  iVar2 = CBB_add_asn1(out,(CBB *)((long)&child.u + 0x18),0x20000010);
  if ((iVar2 == 0) ||
     (iVar2 = CBB_add_asn1_uint64((CBB *)((long)&child.u + 0x18),(ulong)uVar1), iVar2 == 0)) {
    return 0;
  }
  if ((*(byte *)((long)arg + 0x28) & 1) == 0) {
    iVar2 = CBB_add_asn1((CBB *)((long)&child.u + 0x18),(CBB *)((long)&signing_algo.u + 0x18),
                         0x20000010);
    if (iVar2 == 0) {
      return 0;
    }
    in = (X509_NAME *)X509_get_subject_name(*arg);
    iVar2 = x509_marshal_name((CBB *)((long)&signing_algo.u + 0x18),in);
    if (iVar2 == 0) {
      return 0;
    }
    in_00 = X509_get0_serialNumber(*arg);
    iVar2 = asn1_marshal_integer((CBB *)((long)&signing_algo.u + 0x18),in_00,0);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pkey = (EVP_PKEY *)X509_get0_subject_key_id(*arg);
    if ((ASN1_OCTET_STRING *)pkey == (ASN1_OCTET_STRING *)0x0) {
      ERR_put_error(0x21,0,100,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_x509.cc"
                    ,0x1a5);
      return 0;
    }
    data = ASN1_STRING_get0_data((ASN1_STRING *)pkey);
    iVar2 = ASN1_STRING_length((ASN1_STRING *)pkey);
    iVar2 = CBB_add_asn1_element((CBB *)((long)&child.u + 0x18),0x80000000,data,(long)iVar2);
    if (iVar2 == 0) {
      return 0;
    }
  }
  peVar3 = bssl::internal::
           StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
           ::operator->((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                         *)((long)arg + 8));
  ptr = (uint8_t *)EVP_PKEY_CTX_get0_pkey((EVP_PKEY_CTX *)peVar3->pctx);
  iVar2 = EVP_PKEY_id((EVP_PKEY *)ptr);
  if (iVar2 == 6) {
    peVar3 = bssl::internal::
             StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
             ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                    *)((long)arg + 8));
    md = EVP_MD_CTX_get0_md(peVar3);
    iVar2 = EVP_marshal_digest_algorithm_no_params((CBB *)((long)&child.u + 0x18),md);
    if ((((iVar2 != 0) &&
         (iVar2 = CBB_add_asn1((CBB *)((long)&child.u + 0x18),(CBB *)((long)&null.u + 0x18),
                               0x20000010), iVar2 != 0)) &&
        (iVar2 = OBJ_nid2cbb((CBB *)((long)&null.u + 0x18),6), iVar2 != 0)) &&
       (iVar2 = CBB_add_asn1((CBB *)((long)&null.u + 0x18),(CBB *)((long)&signature.u + 0x18),5),
       iVar2 != 0)) {
      pEVar4 = (EVP_MD_CTX *)
               bssl::internal::
               StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
               ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                      *)((long)arg + 8));
      iVar2 = EVP_DigestSignFinal(pEVar4,(uchar *)0x0,&local_140);
      if (((iVar2 != 0) &&
          (iVar2 = CBB_add_asn1((CBB *)((long)&child.u + 0x18),(CBB *)&skid,4), iVar2 != 0)) &&
         (iVar2 = CBB_reserve((CBB *)&skid,(uint8_t **)&sig_len,local_140), iVar2 != 0)) {
        pEVar4 = (EVP_MD_CTX *)
                 bssl::internal::
                 StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                 ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                        *)((long)arg + 8));
        iVar2 = EVP_DigestSignFinal(pEVar4,(uchar *)sig_len,&local_140);
        if (((iVar2 != 0) && (iVar2 = CBB_did_write((CBB *)&skid,local_140), iVar2 != 0)) &&
           (iVar2 = CBB_flush(out), iVar2 != 0)) {
          return 1;
        }
      }
    }
  }
  else {
    ERR_put_error(0x12,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_x509.cc"
                  ,0x1bf);
  }
  return 0;
}

Assistant:

static int write_signer_info(CBB *out, void *arg) {
  auto *si_data = static_cast<struct signer_info_data *>(arg);

  uint64_t version = si_data->use_key_id ? 3u : 1u;
  CBB seq, child, signing_algo, null, signature;
  if (!CBB_add_asn1(out, &seq, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_uint64(&seq, version)) {
    return 0;
  }

  // Output the SignerIdentifier.
  if (si_data->use_key_id) {
    const ASN1_OCTET_STRING *skid =
        X509_get0_subject_key_id(si_data->sign_cert);
    if (skid == nullptr) {
      OPENSSL_PUT_ERROR(CMS, CMS_R_CERTIFICATE_HAS_NO_KEYID);
      return 0;
    }
    // subjectKeyIdentifier is implicitly-tagged.
    if (!CBB_add_asn1_element(&seq, CBS_ASN1_CONTEXT_SPECIFIC | 0,
                              ASN1_STRING_get0_data(skid),
                              ASN1_STRING_length(skid))) {
      return 0;
    }
  } else {
    if (!CBB_add_asn1(&seq, &child, CBS_ASN1_SEQUENCE) ||
        !x509_marshal_name(&child, X509_get_subject_name(si_data->sign_cert)) ||
        !asn1_marshal_integer(&child,
                              X509_get0_serialNumber(si_data->sign_cert),
                              /*tag=*/0)) {
      return 0;
    }
  }

  // Output the digest and signature algorithm. This cannot use X.509 signature
  // algorithms because CMS incorrectly decomposes signature algorithms into a
  // combination of digesting and "encrypting" the digest, then uses the plain
  // rsaEncryption OID instead of the hash-specific RSA OIDs. For now, we only
  // support RSA.
  EVP_PKEY *pkey = EVP_PKEY_CTX_get0_pkey(si_data->sign_ctx->pctx);
  if (EVP_PKEY_id(pkey) != EVP_PKEY_RSA) {
    OPENSSL_PUT_ERROR(PKCS7, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }
  if (!EVP_marshal_digest_algorithm_no_params(
          &seq, EVP_MD_CTX_get0_md(si_data->sign_ctx.get())) ||
      !CBB_add_asn1(&seq, &signing_algo, CBS_ASN1_SEQUENCE) ||
      !OBJ_nid2cbb(&signing_algo, NID_rsaEncryption) ||
      !CBB_add_asn1(&signing_algo, &null, CBS_ASN1_NULL)) {
    return 0;
  }

  // Output the signature.
  uint8_t *ptr;
  size_t sig_len;
  if (!EVP_DigestSignFinal(si_data->sign_ctx.get(), nullptr, &sig_len) ||
      !CBB_add_asn1(&seq, &signature, CBS_ASN1_OCTETSTRING) ||
      !CBB_reserve(&signature, &ptr, sig_len) ||
      !EVP_DigestSignFinal(si_data->sign_ctx.get(), ptr, &sig_len) ||
      !CBB_did_write(&signature, sig_len) ||  //
      !CBB_flush(out)) {
    return 0;
  }

  return 1;
}